

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_edge_detection.cpp
# Opt level: O2

bool edge_detection::DetectVerticalEdge<double>(void)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  uint32_t y;
  uint32_t height;
  uchar value;
  pointer pPVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  uint32_t roiWidth;
  uint32_t roiY;
  uint local_d8;
  uint32_t local_d4;
  uint32_t local_d0;
  uint32_t local_cc;
  uint32_t roiHeight;
  uint32_t roiX;
  ulong local_c0;
  EdgeDetectionBase<double> edgeDetection;
  Image image;
  EdgeParameter local_50;
  
  uVar4 = 0;
  do {
    local_cc = Test_Helper::runCount();
    if (local_cc <= uVar4) {
LAB_0012d2a1:
      return local_cc <= uVar4;
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)&edgeDetection,0,0,'\x01','\x01');
    Unit_Test::blackImage(&image,(Image *)&edgeDetection);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)&edgeDetection);
    Unit_Test::generateRoi(&image,&roiX,&roiY,&roiWidth,&roiHeight);
    height = roiHeight;
    y = roiY;
    auVar8 = in_ZMM1._0_16_;
    local_c0 = (ulong)(roiHeight + roiY);
    if (roiY < 2) {
      if (roiY != 0) {
        bVar5 = false;
        goto LAB_0012d0f2;
      }
      bVar5 = false;
      bVar6 = false;
    }
    else {
      bVar5 = roiY + 1 < image._height;
LAB_0012d0f2:
      bVar6 = roiHeight + roiY + 2 < image._height;
    }
    if ((bVar5) || (bVar6)) {
      local_d4 = roiX;
      local_d0 = roiWidth;
      local_d8 = uVar4;
      value = Test_Helper::randomValue<unsigned_char>('@',0x100);
      Unit_Test::fillImage(&image,local_d4,y,local_d0,height,value);
      edgeDetection.negativeEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      edgeDetection.negativeEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      edgeDetection.positiveEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      edgeDetection.positiveEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      edgeDetection.positiveEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      edgeDetection.negativeEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      in_ZMM1 = ZEXT1664(auVar8);
      EdgeParameter::EdgeParameter(&local_50,TOP_TO_BOTTOM,ANY,ALL,1,1,0,0,'\n');
      EdgeDetectionBase<double>::find(&edgeDetection,&image,&local_50);
      uVar4 = local_d8;
      if (((bVar5) &&
          ((long)edgeDetection.positiveEdgePoint.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)edgeDetection.positiveEdgePoint.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4 != (ulong)roiWidth)) ||
         ((bVar6 && ((long)edgeDetection.negativeEdgePoint.
                           super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)edgeDetection.negativeEdgePoint.
                           super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4 != (ulong)roiWidth)))) {
LAB_0012d289:
        EdgeDetectionBase<double>::~EdgeDetectionBase(&edgeDetection);
        PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
        goto LAB_0012d2a1;
      }
      auVar8 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,roiY);
      pPVar3 = edgeDetection.positiveEdgePoint.
               super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while (pPVar3 != edgeDetection.positiveEdgePoint.
                       super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
        pdVar1 = &pPVar3->y;
        pPVar3 = pPVar3 + 1;
        auVar7._8_8_ = 0x7fffffffffffffff;
        auVar7._0_8_ = 0x7fffffffffffffff;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *pdVar1 - auVar8._0_8_;
        auVar7 = vandpd_avx512vl(auVar9,auVar7);
        in_ZMM1 = ZEXT1664(auVar7);
        if (1.0 < auVar7._0_8_) goto LAB_0012d289;
      }
      auVar8 = vcvtusi2sd_avx512f(in_XMM2,(undefined4)local_c0);
      pPVar3 = edgeDetection.negativeEdgePoint.
               super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while (pPVar3 != edgeDetection.negativeEdgePoint.
                       super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
        pdVar1 = &pPVar3->y;
        pPVar3 = pPVar3 + 1;
        auVar2._8_8_ = 0x7fffffffffffffff;
        auVar2._0_8_ = 0x7fffffffffffffff;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *pdVar1 - auVar8._0_8_;
        auVar7 = vandpd_avx512vl(auVar10,auVar2);
        in_ZMM1 = ZEXT1664(auVar7);
        if (1.0 < auVar7._0_8_) goto LAB_0012d289;
      }
      EdgeDetectionBase<double>::~EdgeDetectionBase(&edgeDetection);
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool DetectVerticalEdge()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            const uint32_t roiYEnd = roiY + roiHeight;
            const bool isValidTopEdge    = ( roiY > 1u ) && ( roiY    + 1u < image.height() );
            const bool isValidBottomEdge = ( roiY > 0u ) && ( roiYEnd + 2u < image.height() );

            if ( !isValidTopEdge && !isValidBottomEdge )
                continue;

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 64, 256 ) );

            EdgeDetectionBase<_Type> edgeDetection;
            edgeDetection.find( image, EdgeParameter( EdgeParameter::TOP_TO_BOTTOM) );

            const std::vector< PointBase2D<_Type> > & positive = edgeDetection.positiveEdge();
            const std::vector< PointBase2D<_Type> > & negative = edgeDetection.negativeEdge();

            if ( ( isValidTopEdge && (positive.size() != roiWidth) ) || ( isValidBottomEdge && (negative.size() != roiWidth) ) )
                return false;

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = positive.cbegin(); point != positive.cend(); ++point ) {
                if ( fabs( point->y - roiY ) > 1.0 )
                    return false;
            }

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = negative.cbegin(); point != negative.cend(); ++point ) {
                if ( fabs( point->y - roiYEnd ) > 1.0 )
                    return false;
            }
        }

        return true;
    }